

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.h
# Opt level: O1

void __thiscall VC1StreamReader::VC1StreamReader(VC1StreamReader *this)

{
  MPEGStreamReader::MPEGStreamReader(&this->super_MPEGStreamReader);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__VC1StreamReader_00242700;
  (this->m_sequence).super_VC1Unit.bitReader.super_BitStream.m_totalBits = 0;
  (this->m_sequence).finterpflag = 0;
  (this->m_sequence).level = '\0';
  (this->m_sequence).pulldown = 0;
  (this->m_sequence).interlace = false;
  (this->m_sequence).tfcntrflag = false;
  (this->m_sequence).super_VC1Unit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  (this->m_sequence).super_VC1Unit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  (this->m_sequence).super_VC1Unit.bitReader.m_curVal = 0;
  (this->m_sequence).super_VC1Unit.bitReader.m_bitLeft = 0;
  (this->m_sequence).super_VC1Unit.m_nalBuffer = (uint8_t *)0x0;
  (this->m_sequence).super_VC1Unit.m_nalBufferLen = 0;
  (this->m_sequence).profile = SIMPLE;
  (this->m_sequence).rangered = 0;
  (this->m_sequence).max_b_frames = '\0';
  (this->m_sequence).coded_width = 0;
  (this->m_sequence).coded_height = 0;
  (this->m_sequence).display_width = 0;
  (this->m_sequence).display_height = 0;
  (this->m_sequence).psf = 0;
  (this->m_sequence).time_base_num = 0;
  (this->m_sequence).time_base_den = 0;
  (this->m_sequence).hrd_param_flag = 0;
  (this->m_sequence).hrd_num_leaky_buckets = '\0';
  (this->m_entryPointBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_entryPointBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_entryPointBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_sequence).sample_aspect_ratio.num = 1;
  (this->m_sequence).sample_aspect_ratio.den = 1;
  (this->m_sequence).m_fpsFieldBitVal = 0;
  (this->m_frame).super_VC1Unit.bitReader.super_BitStream.m_totalBits = 0;
  (this->m_frame).tff = 0;
  (this->m_frame).rff = 0;
  (this->m_frame).rptfrmBitPos = 0;
  (this->m_frame).super_VC1Unit.m_nalBufferLen = 0;
  (this->m_frame).fcm = 0;
  (this->m_frame).pict_type = I_TYPE;
  (this->m_frame).rptfrm = '\0';
  (this->m_frame).super_VC1Unit.bitReader.m_curVal = 0;
  (this->m_frame).super_VC1Unit.bitReader.m_bitLeft = 0;
  (this->m_frame).super_VC1Unit.m_nalBuffer = (uint8_t *)0x0;
  (this->m_frame).super_VC1Unit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  (this->m_frame).super_VC1Unit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  this->m_isFirstFrame = true;
  this->m_spsFound = 0;
  (this->m_frame).pict_type = I_TYPE;
  this->m_lastIFrame = false;
  this->m_firstFileFrame = false;
  this->m_decodedAfterSeq = false;
  this->m_prevDtsInc = 0;
  (this->super_MPEGStreamReader).m_longCodesAllowed = false;
  this->m_nextFrameAddr = (uint8_t *)0x0;
  return;
}

Assistant:

VC1StreamReader()
    {
        m_isFirstFrame = true;
        m_spsFound = 0;
        m_frame.pict_type = VC1PictType::I_TYPE;
        m_lastIFrame = false;
        m_decodedAfterSeq = false;
        m_firstFileFrame = false;
        m_prevDtsInc = false;
        m_longCodesAllowed = false;
        m_nextFrameAddr = nullptr;
    }